

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTargetPropertiesCommand.h
# Opt level: O1

cmCommand * __thiscall cmSetTargetPropertiesCommand::Clone(cmSetTargetPropertiesCommand *this)

{
  cmCommand *pcVar1;
  
  pcVar1 = (cmCommand *)operator_new(0x30);
  pcVar1->Makefile = (cmMakefile *)0x0;
  (pcVar1->Error)._M_dataplus._M_p = (pointer)&(pcVar1->Error).field_2;
  (pcVar1->Error)._M_string_length = 0;
  (pcVar1->Error).field_2._M_local_buf[0] = '\0';
  pcVar1->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0066e718;
  return pcVar1;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmSetTargetPropertiesCommand; }